

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O2

void __thiscall duckdb::MemoryStream::~MemoryStream(MemoryStream *this)

{
  Allocator *this_00;
  
  (this->super_WriteStream)._vptr_WriteStream = (_func_int **)&PTR_WriteData_017753b0;
  (this->super_ReadStream)._vptr_ReadStream = (_func_int **)&DAT_017753e0;
  if (((this->allocator).ptr != (Allocator *)0x0) && (this->data != (data_ptr_t)0x0)) {
    this_00 = optional_ptr<duckdb::Allocator,_true>::operator->(&this->allocator);
    Allocator::FreeData(this_00,this->data,this->capacity);
  }
  return;
}

Assistant:

MemoryStream::~MemoryStream() {
	if (allocator && data) {
		allocator->FreeData(data, capacity);
	}
}